

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

uint vochsh(uchar *t,int len)

{
  ushort **ppuVar1;
  int in_ESI;
  byte *in_RDI;
  uint ret;
  uint local_18;
  uint local_10;
  int local_c;
  byte *local_8;
  
  local_10 = 0;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (6 < in_ESI) {
    local_c = 6;
  }
  for (; local_c != 0; local_c = local_c + -1) {
    if ((*local_8 < 0x80) &&
       (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*local_8] & 0x100) != 0)) {
      local_18 = tolower((uint)*local_8);
    }
    else {
      local_18 = (uint)*local_8;
    }
    local_10 = local_10 + local_18 & 0xff;
    local_8 = local_8 + 1;
  }
  return local_10;
}

Assistant:

uint vochsh(uchar *t, int len)
{
    uint ret = 0;
    
    if (len > 6) len = 6;
    for ( ; len ; --len, ++t)
        ret = (ret + (uint)(vocisupper(*t) ? tolower(*t) : *t))
               & (VOCHASHSIZ - 1);
    return(ret);
}